

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O3

int rhsQS(int Ns,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector *yyS,N_Vector *ypS,N_Vector rrQ,
         N_Vector *rhsvalQS,void *user_data,N_Vector yytmp,N_Vector yptmp,N_Vector tmpQS)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  lVar1 = *(long *)((long)yy->content + 0x10);
  dVar4 = *(double *)((long)user_data + 8) * *(double *)(lVar1 + 0x18);
  dVar5 = *(double *)((long)user_data + 0x20) * *(double *)(lVar1 + 0x20);
  lVar2 = *(long *)((long)(*yyS)->content + 0x10);
  dVar3 = *(double *)((long)user_data + 0x10) * *(double *)(lVar1 + 0x28);
  **(double **)((long)(*rhsvalQS)->content + 0x10) =
       *(double *)(lVar2 + 0x28) * dVar3 +
       *(double *)(lVar2 + 0x18) * dVar4 + *(double *)(lVar2 + 0x20) * dVar5;
  lVar1 = *(long *)((long)yyS[1]->content + 0x10);
  **(double **)((long)rhsvalQS[1]->content + 0x10) =
       dVar3 * *(double *)(lVar1 + 0x28) +
       dVar4 * *(double *)(lVar1 + 0x18) + dVar5 * *(double *)(lVar1 + 0x20);
  return 0;
}

Assistant:

static int rhsQS(int Ns, sunrealtype t, N_Vector yy, N_Vector yp, N_Vector* yyS,
                 N_Vector* ypS, N_Vector rrQ, N_Vector* rhsvalQS,
                 void* user_data, N_Vector yytmp, N_Vector yptmp, N_Vector tmpQS)
{
  sunrealtype v1, v2, v3;
  sunrealtype J1, m2, J2;
  UserData data;
  sunrealtype s1, s2, s3;

  data = (UserData)user_data;

  J1 = data->J1;
  m2 = data->m2;
  J2 = data->J2;

  v1 = Ith(yy, 4);
  v2 = Ith(yy, 5);
  v3 = Ith(yy, 6);

  /* Sensitivities of v. */
  s1 = Ith(yyS[0], 4);
  s2 = Ith(yyS[0], 5);
  s3 = Ith(yyS[0], 6);

  Ith(rhsvalQS[0], 1) = J1 * v1 * s1 + m2 * v2 * s2 + J2 * v3 * s3;

  s1 = Ith(yyS[1], 4);
  s2 = Ith(yyS[1], 5);
  s3 = Ith(yyS[1], 6);

  Ith(rhsvalQS[1], 1) = J1 * v1 * s1 + m2 * v2 * s2 + J2 * v3 * s3;

  return (0);
}